

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.h
# Opt level: O2

void __thiscall AI::Task::Task(Task *this,string *debugName,TaskType type)

{
  _Rb_tree_header *p_Var1;
  
  memset(this,0,0x1b0);
  this->type = type;
  (this->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->parentTaskIndex = -1;
  this->maxRepeats = 0;
  this->remainingRepeats = 0;
  p_Var1 = &(this->modifiedFlags)._M_t._M_impl.super__Rb_tree_header;
  (this->modifiedFlags)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->modifiedFlags)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->modifiedFlags)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->modifiedFlags)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->modifiedFlags)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->modifiedValues)._M_t._M_impl.super__Rb_tree_header;
  (this->modifiedValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->modifiedValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->modifiedValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->modifiedValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->modifiedValues)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->modifiedVectors)._M_t._M_impl.super__Rb_tree_header;
  (this->modifiedVectors)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->modifiedVectors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->modifiedVectors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->modifiedVectors)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->modifiedVectors)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->identifier = Null;
  (this->loop).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->loop)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->loop).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->loop).super__Function_base._M_functor + 8) = 0;
  (this->finally).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->finally)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->finally).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->finally).super__Function_base._M_functor + 8) = 0;
  (this->finish).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->finish)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->finish).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->finish).super__Function_base._M_functor + 8) = 0;
  (this->setup).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->setup)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->setup).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->setup).super__Function_base._M_functor + 8) = 0;
  std::__cxx11::string::string((string *)&this->debugName,(string *)debugName);
  this->isImmediate = false;
  this->isLastInCompound = false;
  this->failed = false;
  (this->parameters).flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->parameters).flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8) = 0;
  (this->parameters).flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  (this->parameters).vectors.super__Vector_base<Math::Vector3,_std::allocator<Math::Vector3>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->parameters).vectors.super__Vector_base<Math::Vector3,_std::allocator<Math::Vector3>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->parameters).vectors.super__Vector_base<Math::Vector3,_std::allocator<Math::Vector3>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->parameters).values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->parameters).values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->parameters).values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->parameters).values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->parameters).flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base + 4) = 0;
  return;
}

Assistant:

Task(std::string debugName, TaskType type = TaskType::Simple)
			: type{type}, debugName{debugName}
			{}